

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlChar * xmlSchemaFormatIDCKeySequence_1
                    (xmlSchemaValidCtxtPtr vctxt,xmlChar **buf,xmlSchemaPSVIIDCKeyPtr *seq,int count
                    ,int for_hash)

{
  xmlSchemaValPtr val;
  xmlSchemaWhitespaceValueType ws;
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *add;
  char *add_00;
  undefined4 in_register_00000084;
  ulong uVar3;
  bool bVar4;
  xmlChar *value;
  xmlChar *local_50;
  int local_44;
  xmlSchemaValidCtxtPtr local_40;
  xmlSchemaPSVIIDCKeyPtr *local_38;
  
  local_50 = (xmlChar *)0x0;
  local_44 = for_hash;
  local_40 = vctxt;
  local_38 = seq;
  pxVar2 = xmlStrdup("[");
  *buf = pxVar2;
  if (0 < count) {
    uVar3 = 0;
    do {
      pxVar2 = xmlStrcat(*buf,"\'");
      *buf = pxVar2;
      val = local_38[uVar3]->val;
      bVar4 = local_44 == 0;
      if (bVar4) {
        ws = xmlSchemaGetWhiteSpaceFacetValue(local_38[uVar3]->type);
      }
      else {
        ws = XML_SCHEMA_WHITESPACE_COLLAPSE;
      }
      iVar1 = xmlSchemaGetCanonValueWhtspExt_1(val,ws,&local_50,(uint)!bVar4);
      if (iVar1 == 0) {
        pxVar2 = *buf;
        add = local_50;
      }
      else {
        xmlSchemaInternalErr2
                  ((xmlSchemaAbstractCtxtPtr)local_40,"xmlSchemaFormatIDCKeySequence",
                   "failed to compute a canonical value",(xmlChar *)0x0,
                   (xmlChar *)CONCAT44(in_register_00000084,for_hash));
        pxVar2 = *buf;
        add = (xmlChar *)"???";
      }
      pxVar2 = xmlStrcat(pxVar2,add);
      *buf = pxVar2;
      add_00 = "\'";
      if (uVar3 < count - 1) {
        add_00 = "\', ";
      }
      pxVar2 = xmlStrcat(pxVar2,(xmlChar *)add_00);
      *buf = pxVar2;
      if (local_50 != (xmlChar *)0x0) {
        (*xmlFree)(local_50);
        local_50 = (xmlChar *)0x0;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)count != uVar3);
    pxVar2 = *buf;
  }
  pxVar2 = xmlStrcat(pxVar2,(xmlChar *)"]");
  *buf = pxVar2;
  return pxVar2;
}

Assistant:

static const xmlChar *
xmlSchemaFormatIDCKeySequence_1(xmlSchemaValidCtxtPtr vctxt,
				xmlChar **buf,
				xmlSchemaPSVIIDCKeyPtr *seq,
				int count, int for_hash)
{
    int i, res;
    xmlChar *value = NULL;

    *buf = xmlStrdup(BAD_CAST "[");
    for (i = 0; i < count; i++) {
	*buf = xmlStrcat(*buf, BAD_CAST "'");
	if (!for_hash)
	    res = xmlSchemaGetCanonValueWhtspExt(seq[i]->val,
		    xmlSchemaGetWhiteSpaceFacetValue(seq[i]->type),
		    &value);
	else {
	    res = xmlSchemaGetCanonValueHash(seq[i]->val, &value);
	}
	if (res == 0)
	    *buf = xmlStrcat(*buf, BAD_CAST value);
	else {
	    VERROR_INT("xmlSchemaFormatIDCKeySequence",
		"failed to compute a canonical value");
	    *buf = xmlStrcat(*buf, BAD_CAST "???");
	}
	if (i < count -1)
	    *buf = xmlStrcat(*buf, BAD_CAST "', ");
	else
	    *buf = xmlStrcat(*buf, BAD_CAST "'");
	if (value != NULL) {
	    xmlFree(value);
	    value = NULL;
	}
    }
    *buf = xmlStrcat(*buf, BAD_CAST "]");

    return (BAD_CAST *buf);
}